

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

ptrdiff_t __thiscall pugi::xml_node::offset_debug(xml_node *this)

{
  xml_node_struct *pxVar1;
  ulong uVar2;
  uint uVar3;
  xml_node xVar4;
  ptrdiff_t pVar5;
  long lStack_10;
  
  xVar4 = root(this);
  pVar5 = -1;
  if (((xVar4._root != (xml_node_struct *)0x0) && (xVar4._root[1].name != (char_t *)0x0)) &&
     (pxVar1 = this->_root, pxVar1 != (xml_node_struct *)0x0)) {
    uVar2 = pxVar1->header;
    uVar3 = (uint)uVar2 & 7;
    if ((0x9cU >> uVar3 & 1) == 0) {
      if ((0x62U >> uVar3 & 1) == 0) {
        return (ulong)uVar3;
      }
      if ((uVar2 & 0x10) != 0) {
        return -1;
      }
      lStack_10 = 0x10;
    }
    else {
      if ((uVar2 & 8) != 0) {
        return -1;
      }
      lStack_10 = 0x18;
    }
    pVar5 = *(long *)((long)&pxVar1->header + lStack_10) - (long)xVar4._root[1].name;
  }
  return pVar5;
}

Assistant:

PUGI__FN ptrdiff_t xml_node::offset_debug() const
	{
		xml_node_struct* r = root()._root;

		if (!r) return -1;

		const char_t* buffer = static_cast<impl::xml_document_struct*>(r)->buffer;

		if (!buffer) return -1;

		switch (type())
		{
		case node_document:
			return 0;

		case node_element:
		case node_declaration:
		case node_pi:
			return (_root->header & impl::xml_memory_page_name_allocated_mask) ? -1 : _root->name - buffer;

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			return (_root->header & impl::xml_memory_page_value_allocated_mask) ? -1 : _root->value - buffer;

		default:
			return -1;
		}
	}